

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CudaBackend.cpp
# Opt level: O0

void __thiscall xmrig::CudaBackendPrivate::printHealth(CudaBackendPrivate *this)

{
  uint uVar1;
  bool bVar2;
  string *__s;
  ulong uVar3;
  size_type sVar4;
  char *pcVar5;
  int extraout_EDX;
  int extraout_EDX_00;
  int __c;
  long in_RDI;
  uint32_t i;
  string fans;
  string clocks;
  NvmlHealth health;
  CudaDevice *device;
  iterator __end2;
  iterator __begin2;
  vector<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_> *__range2;
  uint in_stack_fffffffffffffd78;
  undefined4 in_stack_fffffffffffffd7c;
  String *in_stack_fffffffffffffd80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd88;
  String *in_stack_fffffffffffffd90;
  uint local_260;
  PciTopology *in_stack_fffffffffffffda8;
  PciTopology *in_stack_fffffffffffffdb0;
  undefined4 in_stack_fffffffffffffdb8;
  uint in_stack_fffffffffffffdbc;
  String local_238;
  string local_228 [32];
  string local_208 [32];
  string local_1e8 [32];
  string local_1a8 [32];
  string local_188 [36];
  uint local_164;
  string local_160 [32];
  string local_140 [48];
  string local_110 [32];
  string local_f0 [32];
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [32];
  string local_70 [32];
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_50;
  int local_38;
  int local_34;
  uint local_30;
  uint local_2c;
  reference local_28;
  CudaDevice *local_20;
  __normal_iterator<xmrig::CudaDevice_*,_std::vector<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_>_>
  local_18;
  long local_10;
  
  local_10 = in_RDI + 0x28;
  local_18._M_current =
       (CudaDevice *)
       std::vector<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_>::begin
                 ((vector<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_> *)
                  CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
  local_20 = (CudaDevice *)
             std::vector<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_>::end
                       ((vector<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_> *)
                        CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
  while (bVar2 = __gnu_cxx::operator!=
                           ((__normal_iterator<xmrig::CudaDevice_*,_std::vector<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_>_>
                             *)in_stack_fffffffffffffd80,
                            (__normal_iterator<xmrig::CudaDevice_*,_std::vector<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_>_>
                             *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78)), bVar2
        ) {
    local_28 = __gnu_cxx::
               __normal_iterator<xmrig::CudaDevice_*,_std::vector<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_>_>
               ::operator*(&local_18);
    __s = (string *)CudaDevice::nvmlDevice(local_28);
    NvmlLib::health((nvmlDevice_t)in_stack_fffffffffffffda8);
    std::__cxx11::string::string(local_70);
    if ((local_38 != 0) && (local_34 != 0)) {
      std::__cxx11::to_string((uint)((ulong)in_stack_fffffffffffffda8 >> 0x20));
      std::operator+((char *)in_stack_fffffffffffffd88,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffd80);
      std::operator+(in_stack_fffffffffffffd88,(char *)in_stack_fffffffffffffd80);
      std::__cxx11::to_string((uint)((ulong)in_stack_fffffffffffffda8 >> 0x20));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffdb0);
      std::operator+(in_stack_fffffffffffffd88,(char *)in_stack_fffffffffffffd80);
      __s = local_90;
      std::__cxx11::string::operator+=(local_70,__s);
      std::__cxx11::string::~string(local_90);
      std::__cxx11::string::~string(local_b0);
      std::__cxx11::string::~string(local_140);
      std::__cxx11::string::~string(local_d0);
      std::__cxx11::string::~string(local_f0);
      std::__cxx11::string::~string(local_110);
    }
    std::__cxx11::string::string(local_160);
    bVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                       in_stack_fffffffffffffd90);
    __c = extraout_EDX;
    if (!bVar2) {
      for (local_164 = 0; uVar3 = (ulong)local_164,
          sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&local_50),
          __c = extraout_EDX_00, uVar3 < sVar4; local_164 = local_164 + 1) {
        std::__cxx11::to_string((uint)((ulong)in_stack_fffffffffffffda8 >> 0x20));
        std::operator+((char *)in_stack_fffffffffffffd88,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffd80);
        std::operator+(in_stack_fffffffffffffd88,(char *)in_stack_fffffffffffffd80);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                  (&local_50,(ulong)local_164);
        std::__cxx11::to_string((uint)((ulong)in_stack_fffffffffffffda8 >> 0x20));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffdb0);
        std::operator+(in_stack_fffffffffffffd88,(char *)in_stack_fffffffffffffd80);
        __s = local_188;
        std::__cxx11::string::operator+=(local_160,__s);
        std::__cxx11::string::~string(local_188);
        std::__cxx11::string::~string(local_1a8);
        std::__cxx11::string::~string(local_228);
        std::__cxx11::string::~string((string *)&stack0xfffffffffffffe38);
        std::__cxx11::string::~string(local_1e8);
        std::__cxx11::string::~string(local_208);
      }
    }
    pcVar5 = CudaDevice::index(local_28,(char *)__s,__c);
    in_stack_fffffffffffffdbc = (uint)pcVar5;
    in_stack_fffffffffffffdb0 = CudaDevice::topology(local_28);
    PciTopology::toString(in_stack_fffffffffffffda8);
    in_stack_fffffffffffffda8 = (PciTopology *)String::data(&local_238);
    in_stack_fffffffffffffd78 = local_2c;
    uVar1 = local_30;
    if (local_2c < 0x3c) {
      local_260 = 0x20;
    }
    else {
      local_260 = 0x21;
      if (0x55 < local_2c) {
        local_260 = 0x1f;
      }
    }
    in_stack_fffffffffffffd80 = (String *)std::__cxx11::string::c_str();
    in_stack_fffffffffffffd88 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::__cxx11::string::c_str();
    in_stack_fffffffffffffd90 = in_stack_fffffffffffffd80;
    Log::print(INFO,
               "\x1b[1;36m#%u\x1b[0m\x1b[0;33m %s\x1b[0m\x1b[1;35m%4uW\x1b[0m\x1b[1;%um %2uC\x1b[0m\x1b[1;37m%s\x1b[0m%s"
               ,(ulong)in_stack_fffffffffffffdbc,in_stack_fffffffffffffda8,(ulong)uVar1,
               (ulong)local_260);
    String::~String(in_stack_fffffffffffffd80);
    std::__cxx11::string::~string(local_160);
    std::__cxx11::string::~string(local_70);
    NvmlHealth::~NvmlHealth((NvmlHealth *)0x224a33);
    __gnu_cxx::
    __normal_iterator<xmrig::CudaDevice_*,_std::vector<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_>_>
    ::operator++(&local_18);
  }
  return;
}

Assistant:

void printHealth()
    {
        for (const auto &device : devices) {
            const auto health = NvmlLib::health(device.nvmlDevice());

            std::string clocks;
            if (health.clock && health.memClock) {
                clocks += " " + std::to_string(health.clock) + "/" + std::to_string(health.memClock) + " MHz";
            }

            std::string fans;
            if (!health.fanSpeed.empty()) {
                for (uint32_t i = 0; i < health.fanSpeed.size(); ++i) {
                    fans += " fan" + std::to_string(i) + ":" CYAN_BOLD_S + std::to_string(health.fanSpeed[i]) + "%" CLEAR;
                }
            }

            LOG_INFO(CYAN_BOLD("#%u") YELLOW(" %s") MAGENTA_BOLD("%4uW") CSI "1;%um %2uC" CLEAR WHITE_BOLD("%s") "%s",
                     device.index(),
                     device.topology().toString().data(),
                     health.power,
                     health.temperature < 60 ? 32 : (health.temperature > 85 ? 31 : 33),
                     health.temperature,
                     clocks.c_str(),
                     fans.c_str()
                     );
        }
    }